

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O1

Result TestAnalogInputs(AmpIO **Board,BasePort *Port)

{
  unsigned_long uVar1;
  uint uVar2;
  uint32_t uVar3;
  ostream *poVar4;
  uint index;
  long lVar5;
  Result local_5c;
  long local_58;
  
  (*Port->_vptr_BasePort[0x1d])(Port);
  if (NUM_FPGA < 1) {
    local_5c = pass;
  }
  else {
    local_58 = 0;
    local_5c = pass;
    do {
      if (0 < NUM_CHANNEL_PER_FPGA) {
        uVar2 = (uint)local_58;
        lVar5 = 0;
        do {
          index = (uint)lVar5;
          uVar3 = AmpIO::GetAnalogInput(Board[local_58],index);
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"board ",6);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," pot channel ",0xd);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,index);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected=",10);
          uVar1 = POT_TEST_ADC_COUNT[lVar5 + (ulong)(uVar2 & 0x3fffffff) * 4];
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," measured=",10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          *(uint *)(&DAT_00128490 + *(long *)(logfile + -0x18)) =
               *(uint *)(&DAT_00128490 + *(long *)(logfile + -0x18)) & 0xffffffb5 | 8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"board ",6);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&logfile,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," pot channel ",0xd);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,index);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected=",10);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," measured=",10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          if (ABS((double)(long)(uVar3 - uVar1)) <= 1280.0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," ... \x1b[0;32m[PASS]\x1b[0m",0x16);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
            std::ostream::put('\x18');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"... PASS",8);
LAB_001068a6:
            std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," ... \x1b[1;91m[FAIL]\x1b[0m",0x16);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
            std::ostream::put('\x18');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"... FAIL",8);
            std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"Tolerance=",10);
            poVar4 = std::ostream::_M_insert<unsigned_long>(0x128478);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            local_5c = fail;
            if (ABS((double)(long)((ulong)uVar3 -
                                  POT_TEST_ADC_COUNT[lVar5 + ((ulong)(uVar2 * 4) ^ 4)])) < 1280.0) {
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,COLOR_ERROR_abi_cxx11_._M_dataplus._M_p,
                                  COLOR_ERROR_abi_cxx11_._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"(Looks like the 68-pin cable is crossed!)",0x29);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,COLOR_OFF_abi_cxx11_._M_dataplus._M_p,
                                  COLOR_OFF_abi_cxx11_._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&logfile,"Crossed scsi?",0xd);
              local_5c = fatal_fail;
              goto LAB_001068a6;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < NUM_CHANNEL_PER_FPGA);
      }
      local_58 = local_58 + 1;
    } while (local_58 < NUM_FPGA);
  }
  return local_5c;
}

Assistant:

Result TestAnalogInputs(AmpIO **Board, BasePort *Port) {
    Result result = pass;
    Port->ReadAllBoards();
    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            unsigned long reading = Board[board_index]->GetAnalogInput(channel_index);
            std::cout << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            logfile << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[board_index * 4 + channel_index]) > POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
                logfile << "Tolerance=" << POT_TEST_ADC_ERROR_TOLERANCE << std::endl;
                result = fail;
                // check for swapped cable
                if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[(1 ^ board_index)  * 4 + channel_index]) <
                    POT_TEST_ADC_ERROR_TOLERANCE) {
                    std::cout << COLOR_ERROR << "(Looks like the 68-pin cable is crossed!)" << COLOR_OFF
                                << std::endl;
                    logfile << "Crossed scsi?" << std::endl;
                    result = fatal_fail;
                }

            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }
        }
    }
    
    return result;
}